

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXExportNode.cpp
# Opt level: O1

void __thiscall Assimp::FBX::Node::EndAscii(Node *this,ostream *s,int indent,bool has_children)

{
  undefined3 in_register_00000009;
  char local_1a [2];
  
  if (CONCAT31(in_register_00000009,has_children) != 0) {
    local_1a[1] = 10;
    std::__ostream_insert<char,std::char_traits<char>>(s,local_1a + 1,1);
    if (0 < indent) {
      do {
        local_1a[0] = '\t';
        std::__ostream_insert<char,std::char_traits<char>>(s,local_1a,1);
        indent = indent + -1;
      } while (indent != 0);
    }
    std::__ostream_insert<char,std::char_traits<char>>(s,"}",1);
  }
  return;
}

Assistant:

void FBX::Node::EndAscii(std::ostream& s, int indent, bool has_children)
{
    if (!has_children) { return; } // nothing to do
    s << '\n';
    for (int i = 0; i < indent; ++i) { s << '\t'; }
    s << "}";
}